

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

natwm_error config_find_array(map *config_map,char *key,config_array **result)

{
  config_value *pcVar1;
  config_value *value;
  config_array **result_local;
  char *key_local;
  map *config_map_local;
  
  pcVar1 = config_find(config_map,key);
  if (pcVar1 == (config_value *)0x0) {
    config_map_local._4_4_ = NOT_FOUND_ERROR;
  }
  else if (pcVar1->type == ARRAY) {
    *result = (config_array *)pcVar1->data;
    config_map_local._4_4_ = NO_ERROR;
  }
  else {
    config_map_local._4_4_ = INVALID_INPUT_ERROR;
  }
  return config_map_local._4_4_;
}

Assistant:

enum natwm_error config_find_array(const struct map *config_map, const char *key,
                                   const struct config_array **result)
{
        struct config_value *value = config_find(config_map, key);

        if (value == NULL) {
                return NOT_FOUND_ERROR;
        }

        if (value->type != ARRAY) {
                return INVALID_INPUT_ERROR;
        }

        *result = value->data.array;

        return NO_ERROR;
}